

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

void __thiscall
IRBuilder::BuildArgNoSrc<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
          (IRBuilder *this,OpCode newOpcode,uint32 offset)

{
  ArgSlot argument;
  code *pcVar1;
  bool bVar2;
  RegSlot srcRegSlot;
  undefined4 *puVar3;
  OpLayoutT_ArgNoSrc<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *pOVar4;
  OpLayoutT_ArgNoSrc<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *layout;
  uint32 offset_local;
  OpCode newOpcode_local;
  IRBuilder *this_local;
  
  bVar2 = OpCodeAttr::IsProfiledOp(newOpcode);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x178f,"(!OpCodeAttr::IsProfiledOp(newOpcode))",
                       "!OpCodeAttr::IsProfiledOp(newOpcode)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = OpCodeAttr::HasMultiSizeLayout(newOpcode);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x1790,"(OpCodeAttr::HasMultiSizeLayout(newOpcode))",
                       "OpCodeAttr::HasMultiSizeLayout(newOpcode)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pOVar4 = Js::ByteCodeReader::
           GetLayout<Js::OpLayoutT_ArgNoSrc<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>
                     (&this->m_jnReader);
  argument = pOVar4->Arg;
  srcRegSlot = GetEnvRegForInnerFrameDisplay(this);
  BuildArg(this,ArgOut_A,offset,argument,srcRegSlot);
  return;
}

Assistant:

void
IRBuilder::BuildArgNoSrc(Js::OpCode newOpcode, uint32 offset)
{
    Assert(!OpCodeAttr::IsProfiledOp(newOpcode));
    Assert(OpCodeAttr::HasMultiSizeLayout(newOpcode));
    auto layout = m_jnReader.GetLayout<Js::OpLayoutT_ArgNoSrc<SizePolicy>>();
    BuildArg(Js::OpCode::ArgOut_A, offset, layout->Arg, this->GetEnvRegForInnerFrameDisplay());
}